

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEvents(cmGhsMultiTargetGenerator *this,ostream *fout)

{
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar1;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  pvVar1 = cmGeneratorTarget::GetPreBuildCommands(this->GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"prebuild",&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"preexecShell",&local_5a);
  WriteBuildEventsHelper(this,fout,pvVar1,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->TagType != CUSTOM_TARGET) {
    pvVar1 = cmGeneratorTarget::GetPreLinkCommands(this->GeneratorTarget);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"prelink",&local_59);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"preexecShell",&local_5a)
    ;
    WriteBuildEventsHelper(this,fout,pvVar1,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pvVar1 = cmGeneratorTarget::GetPostBuildCommands(this->GeneratorTarget);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"postbuild",&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"postexecShell",&local_5a);
  WriteBuildEventsHelper(this,fout,pvVar1,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEvents(std::ostream& fout)
{
  this->WriteBuildEventsHelper(
    fout, this->GeneratorTarget->GetPreBuildCommands(),
    std::string("prebuild"), std::string("preexecShell"));

  if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
    this->WriteBuildEventsHelper(
      fout, this->GeneratorTarget->GetPreLinkCommands(),
      std::string("prelink"), std::string("preexecShell"));
  }

  this->WriteBuildEventsHelper(
    fout, this->GeneratorTarget->GetPostBuildCommands(),
    std::string("postbuild"), std::string("postexecShell"));
}